

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_matrix.cpp
# Opt level: O0

Reals __thiscall Omega_h::matrices_times_vectors_dim<3>(Omega_h *this,Reals *ms,Reals *vs)

{
  int size_in;
  void *extraout_RDX;
  Reals RVar1;
  Write<double> local_f8;
  undefined1 local_e8 [8];
  type f;
  allocator local_a1;
  string local_a0 [32];
  undefined1 local_80 [8];
  Write<double> out;
  int n;
  Reals *vs_local;
  Reals *ms_local;
  ulong local_28;
  ulong local_18;
  
  if (((ulong)(vs->write_).shared_alloc_.alloc & 1) == 0) {
    local_18 = ((vs->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_18 = (ulong)(vs->write_).shared_alloc_.alloc >> 3;
  }
  out.shared_alloc_.direct_ptr._4_4_ = divide_no_remainder<int>((int)(local_18 >> 3),3);
  if (((ulong)(ms->write_).shared_alloc_.alloc & 1) == 0) {
    local_28 = ((ms->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_28 = (ulong)(ms->write_).shared_alloc_.alloc >> 3;
  }
  if ((int)(local_28 >> 3) == out.shared_alloc_.direct_ptr._4_4_ * 9) {
    size_in = out.shared_alloc_.direct_ptr._4_4_ * 3;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,"",&local_a1);
    Write<double>::Write((Write<double> *)local_80,size_in,(string *)local_a0);
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    Write<double>::Write((Write<double> *)local_e8,(Write<double> *)local_80);
    Read<double>::Read((Read<double> *)&f.out.shared_alloc_.direct_ptr,ms);
    Read<double>::Read((Read<double> *)&f.ms.write_.shared_alloc_.direct_ptr,vs);
    parallel_for<Omega_h::matrices_times_vectors_dim<3>(Omega_h::Read<double>,Omega_h::Read<double>)::_lambda(int)_1_>
              (out.shared_alloc_.direct_ptr._4_4_,(type *)local_e8,"matrices_times_vectors");
    Write<double>::Write(&local_f8,(Write<signed_char> *)local_80);
    Read<double>::Read((Read<double> *)this,&local_f8);
    Write<double>::~Write(&local_f8);
    matrices_times_vectors_dim<3>(Omega_h::Read<double>,Omega_h::Read<double>)::{lambda(int)#1}::
    ~Read((_lambda_int__1_ *)local_e8);
    Write<double>::~Write((Write<double> *)local_80);
    RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
    RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Reals)RVar1.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","ms.size() == n * matrix_ncomps(dim, dim)",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_matrix.cpp"
       ,0x35);
}

Assistant:

Reals matrices_times_vectors_dim(Reals ms, Reals vs) {
  auto n = divide_no_remainder(vs.size(), dim);
  OMEGA_H_CHECK(ms.size() == n * matrix_ncomps(dim, dim));
  auto out = Write<Real>(n * dim);
  auto f = OMEGA_H_LAMBDA(LO i) {
    set_vector(out, i, get_matrix<dim, dim>(ms, i) * get_vector<dim>(vs, i));
  };
  parallel_for(n, f, "matrices_times_vectors");
  return out;
}